

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivisionExpression.cpp
# Opt level: O2

BaseExpressionPtr __thiscall
Kandinsky::DivisionExpression::derivative(DivisionExpression *this,VariableExpressionPtr *variable)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *arg2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  BaseExpressionPtr BVar1;
  BaseExpressionPtr arg2Derivative;
  shared_ptr<Kandinsky::BaseExpression> sStack_c8;
  shared_ptr<Kandinsky::BaseExpression> local_b8;
  undefined1 local_a8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a0;
  Expression local_98;
  Expression local_80;
  Expression local_68;
  Expression local_50;
  Expression local_38;
  
  (*(variable[1].super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>.
     _M_refcount._M_pi)->_vptr__Sp_counted_base[1])(local_a8);
  (*((variable->super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>).
     _M_refcount._M_pi)->_vptr__Sp_counted_base[1])(&local_b8);
  arg2 = &variable[1].super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount;
  operator/<std::shared_ptr<Kandinsky::BaseExpression>,_std::shared_ptr<Kandinsky::BaseExpression>,_nullptr>
            (&local_50,&local_b8,(shared_ptr<Kandinsky::BaseExpression> *)arg2);
  (*arg2->_M_pi->_vptr__Sp_counted_base[1])(&sStack_c8);
  operator*<std::shared_ptr<Kandinsky::BaseExpression>,_std::shared_ptr<Kandinsky::BaseExpression>,_nullptr>
            (&local_98,
             (shared_ptr<Kandinsky::BaseExpression> *)
             &(variable->
              super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount,&sStack_c8);
  operator/<Kandinsky::Expression,_std::shared_ptr<Kandinsky::BaseExpression>,_nullptr>
            (&local_80,&local_98,(shared_ptr<Kandinsky::BaseExpression> *)arg2);
  operator/<Kandinsky::Expression,_std::shared_ptr<Kandinsky::BaseExpression>,_nullptr>
            (&local_68,&local_80,(shared_ptr<Kandinsky::BaseExpression> *)arg2);
  operator-<Kandinsky::Expression,_Kandinsky::Expression,_nullptr>(&local_38,&local_50,&local_68);
  BaseExpression::makePtr<Kandinsky::Expression>((BaseExpression *)this,&local_38);
  Expression::~Expression(&local_38);
  Expression::~Expression(&local_68);
  Expression::~Expression(&local_80);
  Expression::~Expression(&local_98);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&sStack_c8.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  Expression::~Expression(&local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_b8.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a0);
  BVar1.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  BVar1.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (BaseExpressionPtr)
         BVar1.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

BaseExpressionPtr DivisionExpression::derivative(const VariableExpressionPtr& variable) const
    {
        BaseExpressionPtr arg2Derivative = m_arg2->derivative(variable);
        return makePtr(m_arg1->derivative(variable) / m_arg2 -
                m_arg1 * m_arg2->derivative(variable) / m_arg2 / m_arg2);
    }